

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

bool __thiscall CConsole::ExecuteFile(CConsole *this,char *pFilename)

{
  char cVar1;
  long lVar2;
  IStorage *pIVar3;
  int iVar4;
  IOHANDLE IoHandle;
  char *pcVar5;
  bool bVar6;
  CExecFile *pCVar7;
  long in_FS_OFFSET;
  CExecFile ThisFile;
  CLineReader LineReader;
  char aBuf [256];
  undefined4 extraout_var;
  
  LineReader.m_aBuffer[0x120] = '\0';
  LineReader.m_aBuffer[0x121] = '\0';
  LineReader.m_aBuffer[0x122] = '\0';
  LineReader.m_aBuffer[0x123] = '\0';
  LineReader.m_aBuffer[0x124] = '\0';
  LineReader.m_aBuffer[0x125] = '\0';
  LineReader.m_aBuffer[0x126] = '\0';
  LineReader.m_aBuffer[0x127] = '\0';
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  for (pCVar7 = this->m_pFirstExec; pCVar7 != (CExecFile *)0x0; pCVar7 = pCVar7->m_pPrev) {
    iVar4 = str_comp(pFilename,pCVar7->m_pFilename);
    if (iVar4 == 0) goto LAB_001b7e36;
  }
  pIVar3 = this->m_pStorage;
  if (pIVar3 == (IStorage *)0x0) {
LAB_001b7e36:
    bVar6 = false;
  }
  else {
    pCVar7 = this->m_pFirstExec;
    this->m_pFirstExec = &ThisFile;
    ThisFile.m_pFilename = pFilename;
    ThisFile.m_pPrev = pCVar7;
    iVar4 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,pFilename,9,0xffffffff,0,0,0,0)
    ;
    IoHandle = (IOHANDLE)CONCAT44(extraout_var,iVar4);
    bVar6 = IoHandle != (IOHANDLE)0x0;
    if (IoHandle == (IOHANDLE)0x0) {
      str_format(aBuf,0x100,"failed to open \'%s\'",pFilename);
      (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf,0);
      cVar1 = *pFilename;
      if ((cVar1 != '\0') &&
         (((cVar1 == '/' || (cVar1 == '\\')) ||
          ((pFilename[1] == ':' && ((pFilename[2] == '\\' || (pFilename[2] == '/')))))))) {
        (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])
                  (this,0,"console",
                   "Info: only relative paths starting from the ones you specify in \'storage.cfg\' are allowed"
                   ,0);
      }
    }
    else {
      str_format(aBuf,0x100,"executing \'%s\'",pFilename);
      (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf,0);
      CLineReader::Init(&LineReader,IoHandle);
      pcVar5 = CLineReader::Get(&LineReader);
      if (pcVar5 != (char *)0x0) {
        do {
          (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x13])(this,pcVar5);
          pcVar5 = CLineReader::Get(&LineReader);
        } while (pcVar5 != (char *)0x0);
      }
      io_close(IoHandle);
    }
    this->m_pFirstExec = pCVar7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool CConsole::ExecuteFile(const char *pFilename)
{
	// make sure that this isn't being executed already
	for(CExecFile *pCur = m_pFirstExec; pCur; pCur = pCur->m_pPrev)
		if(str_comp(pFilename, pCur->m_pFilename) == 0)
			return false;

	if(!m_pStorage)
		return false;

	// push this one to the stack
	CExecFile ThisFile;
	CExecFile *pPrev = m_pFirstExec;
	ThisFile.m_pFilename = pFilename;
	ThisFile.m_pPrev = m_pFirstExec;
	m_pFirstExec = &ThisFile;

	// exec the file
	IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_READ | IOFLAG_SKIP_BOM, IStorage::TYPE_ALL);

	char aBuf[256];
	if(File)
	{
		str_format(aBuf, sizeof(aBuf), "executing '%s'", pFilename);
		Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);

		CLineReader LineReader;
		LineReader.Init(File);
		const char *pLine;
		while((pLine = LineReader.Get()))
			ExecuteLine(pLine);

		io_close(File);
	}
	else
	{
		str_format(aBuf, sizeof(aBuf), "failed to open '%s'", pFilename);
		Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);
		bool AbsHeur = false;
		AbsHeur = AbsHeur || (pFilename[0] == '/' || pFilename[0] == '\\');
		AbsHeur = AbsHeur || (pFilename[0] && pFilename[1] == ':' && (pFilename[2] == '/' || pFilename[2] == '\\'));
		if(AbsHeur)
		{
			Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "Info: only relative paths starting from the ones you specify in 'storage.cfg' are allowed");
		}
	}

	m_pFirstExec = pPrev;
	return (bool)File;
}